

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GatherLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gather(NeuralNetworkLayer *this)

{
  bool bVar1;
  GatherLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_gather(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_gather(this);
    this_00 = (GatherLayerParams *)operator_new(0x20);
    GatherLayerParams::GatherLayerParams(this_00);
    (this->layer_).gather_ = this_00;
  }
  return (GatherLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherLayerParams* NeuralNetworkLayer::mutable_gather() {
  if (!has_gather()) {
    clear_layer();
    set_has_gather();
    layer_.gather_ = new ::CoreML::Specification::GatherLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gather)
  return layer_.gather_;
}